

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framing.c
# Opt level: O2

int ogg_stream_pageout_fill(ogg_stream_state *os,ogg_page *og,int nfill)

{
  int iVar1;
  uint uVar2;
  uchar *puVar3;
  ulong uVar4;
  uint *__dest;
  byte bVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  
  if ((os == (ogg_stream_state *)0x0) || (os->body_data == (uchar *)0x0)) {
    return 0;
  }
  if (os->e_o_s != 0) {
    if (os->lacing_fill == 0) {
      iVar6 = ogg_stream_flush_i(os,og,0,nfill);
      return iVar6;
    }
LAB_001c4f2a:
    iVar6 = ogg_stream_flush_i(os,og,1,nfill);
    return iVar6;
  }
  bVar15 = false;
  if ((os->lacing_fill != 0) && (os->b_o_s == 0)) goto LAB_001c4f2a;
  puVar3 = os->body_data;
  uVar4 = os->lacing_fill;
  uVar14 = 0xff;
  if ((long)uVar4 < 0xff) {
    uVar14 = uVar4;
  }
  iVar6 = (int)uVar14;
  if (iVar6 == 0 || puVar3 == (uchar *)0x0) {
    return 0;
  }
  iVar1 = os->b_o_s;
  if (iVar1 == 0) {
    uVar8 = 0;
    uVar14 = uVar14 & 0xffffffff;
    if (iVar6 < 1) {
      uVar14 = uVar8;
    }
    for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
      if ((char)os->lacing_vals[uVar12] != -1) {
        uVar8 = 0;
        uVar14 = (ulong)((int)uVar12 + 1);
        break;
      }
    }
  }
  else {
    uVar12 = 0;
    uVar14 = uVar14 & 0xffffffff;
    if (iVar6 < 1) {
      uVar14 = uVar12;
    }
    uVar8 = 0xffffffffffffffff;
    lVar13 = 0;
    iVar9 = 0;
    iVar6 = 0;
    for (; bVar15 = false, uVar14 != uVar12; uVar12 = uVar12 + 1) {
      if ((nfill < lVar13) && (3 < iVar6)) {
        uVar14 = uVar12 & 0xffffffff;
        bVar15 = true;
        break;
      }
      iVar6 = 0;
      if ((ulong)*(byte *)(os->lacing_vals + uVar12) != 0xff) {
        uVar8 = os->granule_vals[uVar12];
        iVar9 = iVar9 + 1;
        iVar6 = iVar9;
      }
      lVar13 = lVar13 + (ulong)*(byte *)(os->lacing_vals + uVar12);
    }
    uVar11 = 0xff;
    if ((int)uVar14 == 0xff) goto LAB_001c4d41;
  }
  uVar11 = (uint)uVar14;
  if (!bVar15) {
    return 0;
  }
LAB_001c4d41:
  builtin_memcpy(os->header,"OggS",5);
  os->header[5] = '\0';
  __dest = (uint *)os->lacing_vals;
  bVar15 = (*__dest >> 8 & 1) == 0;
  bVar5 = bVar15 + 2;
  if (iVar1 != 0) {
    bVar5 = bVar15;
  }
  os->header[5] = bVar5;
  uVar14 = (ulong)(int)uVar11;
  if ((os->e_o_s != 0) && (uVar4 == uVar14)) {
    os->header[5] = bVar5 | 4;
  }
  os->b_o_s = 1;
  for (lVar13 = 0; lVar13 != 8; lVar13 = lVar13 + 1) {
    os->header[lVar13 + 6] = (uchar)uVar8;
    uVar8 = (long)uVar8 >> 8;
  }
  lVar13 = os->serialno;
  for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
    os->header[lVar10 + 0xe] = (uchar)lVar13;
    lVar13 = lVar13 >> 8;
  }
  lVar10 = 0;
  lVar13 = os->pageno;
  if (os->pageno == -1) {
    lVar13 = lVar10;
  }
  os->pageno = lVar13 + 1;
  for (; lVar10 != 4; lVar10 = lVar10 + 1) {
    os->header[lVar10 + 0x12] = (uchar)lVar13;
    lVar13 = lVar13 >> 8;
  }
  os->header[0x16] = '\0';
  os->header[0x17] = '\0';
  os->header[0x18] = '\0';
  os->header[0x19] = '\0';
  os->header[0x1a] = (uchar)uVar11;
  uVar8 = 0;
  uVar12 = 0;
  if (0 < (int)uVar11) {
    uVar12 = (ulong)uVar11;
  }
  uVar7 = 0;
  for (; uVar12 != uVar8; uVar8 = uVar8 + 1) {
    uVar2 = __dest[uVar8];
    os->header[uVar8 + 0x1b] = (uchar)uVar2;
    uVar7 = uVar7 + (uVar2 & 0xff);
  }
  og->header = os->header;
  os->header_fill = uVar11 + 0x1b;
  og->header_len = (long)(int)(uVar11 + 0x1b);
  og->body = puVar3 + os->body_returned;
  og->body_len = (ulong)uVar7;
  os->lacing_fill = uVar4 - uVar14;
  memmove(__dest,__dest + uVar14,(uVar4 - uVar14) * 4);
  memmove(os->granule_vals,os->granule_vals + uVar14,os->lacing_fill << 3);
  os->body_returned = os->body_returned + (ulong)uVar7;
  ogg_page_checksum_set(og);
  return 1;
}

Assistant:

int ogg_stream_pageout_fill(ogg_stream_state *os, ogg_page *og, int nfill){
  int force=0;
  if(ogg_stream_check(os)) return 0;

  if((os->e_o_s&&os->lacing_fill) ||          /* 'were done, now flush' case */
     (os->lacing_fill&&!os->b_o_s))           /* 'initial header page' case */
    force=1;

  return(ogg_stream_flush_i(os,og,force,nfill));
}